

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O2

void whisper_print_usage(int param_1,char **argv,whisper_params *params)

{
  char *pcVar1;
  undefined4 in_register_0000003c;
  char *pcVar2;
  
  fputc(10,_stderr);
  fprintf(_stderr,"usage: %s [options] file0 file1 ...\n",
          *(undefined8 *)CONCAT44(in_register_0000003c,param_1));
  fwrite("supported audio formats: flac, mp3, ogg, wav\n",0x2d,1,_stderr);
  fputc(10,_stderr);
  fwrite("options:\n",9,1,_stderr);
  fwrite("  -h,        --help              [default] show this help message and exit\n",0x4b,1,
         _stderr);
  fprintf(_stderr,
          "  -t N,      --threads N         [%-7d] number of threads to use during computation\n",
          (ulong)*(uint *)argv);
  fprintf(_stderr,
          "  -p N,      --processors N      [%-7d] number of processors to use during computation\n"
          ,(ulong)*(uint *)((long)argv + 4));
  fprintf(_stderr,"  -ot N,     --offset-t N        [%-7d] time offset in milliseconds\n",
          (ulong)*(uint *)(argv + 1));
  fprintf(_stderr,"  -on N,     --offset-n N        [%-7d] segment index offset\n",
          (ulong)*(uint *)((long)argv + 0xc));
  fprintf(_stderr,
          "  -d  N,     --duration N        [%-7d] duration of audio to process in milliseconds\n",
          (ulong)*(uint *)(argv + 2));
  fprintf(_stderr,
          "  -mc N,     --max-context N     [%-7d] maximum number of text context tokens to store\n"
          ,(ulong)*(uint *)(argv + 3));
  fprintf(_stderr,"  -ml N,     --max-len N         [%-7d] maximum segment length in characters\n",
          (ulong)*(uint *)((long)argv + 0x1c));
  pcVar2 = "false";
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x4d) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -sow,      --split-on-word     [%-7s] split on word rather than on token\n",
          pcVar1);
  fprintf(_stderr,"  -bo N,     --best-of N         [%-7d] number of best candidates to keep\n",
          (ulong)*(uint *)(argv + 4));
  fprintf(_stderr,"  -bs N,     --beam-size N       [%-7d] beam size for beam search\n",
          (ulong)*(uint *)((long)argv + 0x24));
  fprintf(_stderr,"  -ac N,     --audio-ctx N       [%-7d] audio context size (0 - all)\n",
          (ulong)*(uint *)(argv + 5));
  fprintf(_stderr,"  -wt N,     --word-thold N      [%-7.2f] word timestamp probability threshold\n"
          ,(double)*(float *)((long)argv + 0x2c));
  fprintf(_stderr,"  -et N,     --entropy-thold N   [%-7.2f] entropy threshold for decoder fail\n",
          (double)*(float *)(argv + 6));
  fprintf(_stderr,
          "  -lpt N,    --logprob-thold N   [%-7.2f] log probability threshold for decoder fail\n",
          (double)*(float *)((long)argv + 0x34));
  fprintf(_stderr,"  -nth N,    --no-speech-thold N [%-7.2f] no speech threshold\n",
          (double)*(float *)(argv + 7));
  fprintf(_stderr,
          "  -tp,       --temperature N     [%-7.2f] The sampling temperature, between 0 and 1\n",
          (double)*(float *)(argv + 8));
  fprintf(_stderr,
          "  -tpi,      --temperature-inc N [%-7.2f] The increment of temperature, between 0 and 1\n"
          ,(double)*(float *)((long)argv + 0x44));
  pcVar1 = "false";
  if (*(char *)(argv + 9) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -debug,    --debug-mode        [%-7s] enable debug mode (eg. dump log_mel)\n",
          pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x49) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -tr,       --translate         [%-7s] translate from source language to english\n",
          pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x4b) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -di,       --diarize           [%-7s] stereo audio diarization\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x4c) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -tdrz,     --tinydiarize       [%-7s] enable tinydiarize (requires a tdrz model)\n",
          pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x4e) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -nf,       --no-fallback       [%-7s] do not use temperature fallback while decoding\n"
          ,pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x4f) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -otxt,     --output-txt        [%-7s] output result in a text file\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)(argv + 10) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -ovtt,     --output-vtt        [%-7s] output result in a vtt file\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x51) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -osrt,     --output-srt        [%-7s] output result in a srt file\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x56) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -olrc,     --output-lrc        [%-7s] output result in a lrc file\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x52) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -owts,     --output-words      [%-7s] output script for generating karaoke video\n",
          pcVar1);
  fprintf(_stderr,
          "  -fp,       --font-path         [%-7s] path to a monospace font for karaoke video\n",
          argv[0x14]);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x53) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -ocsv,     --output-csv        [%-7s] output result in a CSV file\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x54) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -oj,       --output-json       [%-7s] output result in a JSON file\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x55) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -ojf,      --output-json-full  [%-7s] include more information in the JSON file\n",
          pcVar1);
  fprintf(_stderr,
          "  -of FNAME, --output-file FNAME [%-7s] output file path (without file extension)\n","");
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x57) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -np,       --no-prints         [%-7s] do not print anything other than the results\n",
          pcVar1);
  pcVar1 = "false";
  if (*(char *)(argv + 0xb) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -ps,       --print-special     [%-7s] print special tokens\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x59) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -pc,       --print-colors      [%-7s] print colors\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x5a) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -pp,       --print-progress    [%-7s] print progress\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x5b) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -nt,       --no-timestamps     [%-7s] do not print timestamps\n",pcVar1);
  fprintf(_stderr,
          "  -l LANG,   --language LANG     [%-7s] spoken language (\'auto\' for auto-detect)\n",
          argv[0xc]);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x4a) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,
          "  -dl,       --detect-language   [%-7s] exit after automatically detecting language\n",
          pcVar1);
  fprintf(_stderr,
          "             --prompt PROMPT     [%-7s] initial prompt (max n_text_ctx/2 tokens)\n",
          argv[0x10]);
  fprintf(_stderr,"  -m FNAME,  --model FNAME       [%-7s] model path\n",argv[0x18]);
  fprintf(_stderr,"  -f FNAME,  --file FNAME        [%-7s] input audio file path\n","");
  fprintf(_stderr,
          "  -oved D,   --ov-e-device DNAME [%-7s] the OpenVINO device used for encode inference\n",
          argv[0x2c]);
  fprintf(_stderr,"  -dtw MODEL --dtw MODEL         [%-7s] compute token-level timestamps\n",
          argv[0x30]);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x5c) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -ls,       --log-score         [%-7s] log best decoder scores of tokens\n",
          pcVar1);
  pcVar1 = "true";
  if (*(char *)((long)argv + 0x5d) != '\0') {
    pcVar1 = "false";
  }
  fprintf(_stderr,"  -ng,       --no-gpu            [%-7s] disable GPU\n",pcVar1);
  pcVar1 = "false";
  if (*(char *)((long)argv + 0x5e) != '\0') {
    pcVar1 = "true";
  }
  fprintf(_stderr,"  -fa,       --flash-attn        [%-7s] flash attention\n",pcVar1);
  if (*(char *)((long)argv + 0x5f) != '\0') {
    pcVar2 = "true";
  }
  fprintf(_stderr,"  -sns,      --suppress-nst      [%-7s] suppress non-speech tokens\n",pcVar2);
  fprintf(_stderr,
          "  --suppress-regex REGEX         [%-7s] regular expression matching tokens to suppress\n"
          ,argv[0x28]);
  fprintf(_stderr,"  --grammar GRAMMAR              [%-7s] GBNF grammar to guide decoding\n",
          argv[0x1c]);
  fprintf(_stderr,"  --grammar-rule RULE            [%-7s] top-level GBNF grammar rule name\n",
          argv[0x20]);
  fprintf(_stderr,
          "  --grammar-penalty N            [%-7.1f] scales down logits of nongrammar tokens\n",
          (double)*(float *)((long)argv + 0x3c));
  fputc(10,_stderr);
  return;
}

Assistant:

static void whisper_print_usage(int /*argc*/, char ** argv, const whisper_params & params) {
    fprintf(stderr, "\n");
    fprintf(stderr, "usage: %s [options] file0 file1 ...\n", argv[0]);
    fprintf(stderr, "supported audio formats: flac, mp3, ogg, wav\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h,        --help              [default] show this help message and exit\n");
    fprintf(stderr, "  -t N,      --threads N         [%-7d] number of threads to use during computation\n",    params.n_threads);
    fprintf(stderr, "  -p N,      --processors N      [%-7d] number of processors to use during computation\n", params.n_processors);
    fprintf(stderr, "  -ot N,     --offset-t N        [%-7d] time offset in milliseconds\n",                    params.offset_t_ms);
    fprintf(stderr, "  -on N,     --offset-n N        [%-7d] segment index offset\n",                           params.offset_n);
    fprintf(stderr, "  -d  N,     --duration N        [%-7d] duration of audio to process in milliseconds\n",   params.duration_ms);
    fprintf(stderr, "  -mc N,     --max-context N     [%-7d] maximum number of text context tokens to store\n", params.max_context);
    fprintf(stderr, "  -ml N,     --max-len N         [%-7d] maximum segment length in characters\n",           params.max_len);
    fprintf(stderr, "  -sow,      --split-on-word     [%-7s] split on word rather than on token\n",             params.split_on_word ? "true" : "false");
    fprintf(stderr, "  -bo N,     --best-of N         [%-7d] number of best candidates to keep\n",              params.best_of);
    fprintf(stderr, "  -bs N,     --beam-size N       [%-7d] beam size for beam search\n",                      params.beam_size);
    fprintf(stderr, "  -ac N,     --audio-ctx N       [%-7d] audio context size (0 - all)\n",                   params.audio_ctx);
    fprintf(stderr, "  -wt N,     --word-thold N      [%-7.2f] word timestamp probability threshold\n",         params.word_thold);
    fprintf(stderr, "  -et N,     --entropy-thold N   [%-7.2f] entropy threshold for decoder fail\n",           params.entropy_thold);
    fprintf(stderr, "  -lpt N,    --logprob-thold N   [%-7.2f] log probability threshold for decoder fail\n",   params.logprob_thold);
    fprintf(stderr, "  -nth N,    --no-speech-thold N [%-7.2f] no speech threshold\n",                          params.no_speech_thold);
    fprintf(stderr, "  -tp,       --temperature N     [%-7.2f] The sampling temperature, between 0 and 1\n",    params.temperature);
    fprintf(stderr, "  -tpi,      --temperature-inc N [%-7.2f] The increment of temperature, between 0 and 1\n",params.temperature_inc);
    fprintf(stderr, "  -debug,    --debug-mode        [%-7s] enable debug mode (eg. dump log_mel)\n",           params.debug_mode ? "true" : "false");
    fprintf(stderr, "  -tr,       --translate         [%-7s] translate from source language to english\n",      params.translate ? "true" : "false");
    fprintf(stderr, "  -di,       --diarize           [%-7s] stereo audio diarization\n",                       params.diarize ? "true" : "false");
    fprintf(stderr, "  -tdrz,     --tinydiarize       [%-7s] enable tinydiarize (requires a tdrz model)\n",     params.tinydiarize ? "true" : "false");
    fprintf(stderr, "  -nf,       --no-fallback       [%-7s] do not use temperature fallback while decoding\n", params.no_fallback ? "true" : "false");
    fprintf(stderr, "  -otxt,     --output-txt        [%-7s] output result in a text file\n",                   params.output_txt ? "true" : "false");
    fprintf(stderr, "  -ovtt,     --output-vtt        [%-7s] output result in a vtt file\n",                    params.output_vtt ? "true" : "false");
    fprintf(stderr, "  -osrt,     --output-srt        [%-7s] output result in a srt file\n",                    params.output_srt ? "true" : "false");
    fprintf(stderr, "  -olrc,     --output-lrc        [%-7s] output result in a lrc file\n",                    params.output_lrc ? "true" : "false");
    fprintf(stderr, "  -owts,     --output-words      [%-7s] output script for generating karaoke video\n",     params.output_wts ? "true" : "false");
    fprintf(stderr, "  -fp,       --font-path         [%-7s] path to a monospace font for karaoke video\n",     params.font_path.c_str());
    fprintf(stderr, "  -ocsv,     --output-csv        [%-7s] output result in a CSV file\n",                    params.output_csv ? "true" : "false");
    fprintf(stderr, "  -oj,       --output-json       [%-7s] output result in a JSON file\n",                   params.output_jsn ? "true" : "false");
    fprintf(stderr, "  -ojf,      --output-json-full  [%-7s] include more information in the JSON file\n",      params.output_jsn_full ? "true" : "false");
    fprintf(stderr, "  -of FNAME, --output-file FNAME [%-7s] output file path (without file extension)\n",      "");
    fprintf(stderr, "  -np,       --no-prints         [%-7s] do not print anything other than the results\n",   params.no_prints ? "true" : "false");
    fprintf(stderr, "  -ps,       --print-special     [%-7s] print special tokens\n",                           params.print_special ? "true" : "false");
    fprintf(stderr, "  -pc,       --print-colors      [%-7s] print colors\n",                                   params.print_colors ? "true" : "false");
    fprintf(stderr, "  -pp,       --print-progress    [%-7s] print progress\n",                                 params.print_progress ? "true" : "false");
    fprintf(stderr, "  -nt,       --no-timestamps     [%-7s] do not print timestamps\n",                        params.no_timestamps ? "true" : "false");
    fprintf(stderr, "  -l LANG,   --language LANG     [%-7s] spoken language ('auto' for auto-detect)\n",       params.language.c_str());
    fprintf(stderr, "  -dl,       --detect-language   [%-7s] exit after automatically detecting language\n",    params.detect_language ? "true" : "false");
    fprintf(stderr, "             --prompt PROMPT     [%-7s] initial prompt (max n_text_ctx/2 tokens)\n",       params.prompt.c_str());
    fprintf(stderr, "  -m FNAME,  --model FNAME       [%-7s] model path\n",                                     params.model.c_str());
    fprintf(stderr, "  -f FNAME,  --file FNAME        [%-7s] input audio file path\n",                            "");
    fprintf(stderr, "  -oved D,   --ov-e-device DNAME [%-7s] the OpenVINO device used for encode inference\n",  params.openvino_encode_device.c_str());
    fprintf(stderr, "  -dtw MODEL --dtw MODEL         [%-7s] compute token-level timestamps\n",                 params.dtw.c_str());
    fprintf(stderr, "  -ls,       --log-score         [%-7s] log best decoder scores of tokens\n",              params.log_score?"true":"false");
    fprintf(stderr, "  -ng,       --no-gpu            [%-7s] disable GPU\n",                                    params.use_gpu ? "false" : "true");
    fprintf(stderr, "  -fa,       --flash-attn        [%-7s] flash attention\n",                                params.flash_attn ? "true" : "false");
    fprintf(stderr, "  -sns,      --suppress-nst      [%-7s] suppress non-speech tokens\n",                     params.suppress_nst ? "true" : "false");
    fprintf(stderr, "  --suppress-regex REGEX         [%-7s] regular expression matching tokens to suppress\n", params.suppress_regex.c_str());
    fprintf(stderr, "  --grammar GRAMMAR              [%-7s] GBNF grammar to guide decoding\n",                 params.grammar.c_str());
    fprintf(stderr, "  --grammar-rule RULE            [%-7s] top-level GBNF grammar rule name\n",               params.grammar_rule.c_str());
    fprintf(stderr, "  --grammar-penalty N            [%-7.1f] scales down logits of nongrammar tokens\n",      params.grammar_penalty);
    fprintf(stderr, "\n");
}